

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double inverse_gaussian_sample(double a,double b,int *seed)

{
  double dVar1;
  double dVar2;
  double z;
  double y;
  double x;
  double u;
  double t;
  double phi;
  int *seed_local;
  double b_local;
  double a_local;
  
  dVar1 = normal_01_sample(seed);
  dVar1 = dVar1 * dVar1;
  dVar2 = sqrt((b / a) * 4.0 * dVar1 + dVar1 * dVar1);
  dVar1 = ((dVar1 - dVar2) * 0.5) / (b / a) + 1.0;
  dVar2 = r8_uniform_01(seed);
  if (1.0 < dVar2 * (dVar1 + 1.0)) {
    y = a / dVar1;
  }
  else {
    y = a * dVar1;
  }
  return y;
}

Assistant:

double inverse_gaussian_sample ( double a, double b, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    INVERSE_GAUSSIAN_SAMPLE samples the Inverse Gaussian PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double INVERSE_GAUSSIAN_SAMPLE, a sample of the PDF.
//
{
  double phi;
  double t;
  double u;
  double x;
  double y;
  double z;

  phi = b / a;
  z = normal_01_sample ( seed );
  y = z * z;

  t = 1.0 + 0.5 * ( y - sqrt ( 4.0 * phi * y + y * y ) ) / phi;
  u = r8_uniform_01 ( seed );

  if ( u * ( 1.0 + t ) <= 1.0 )
  {
    x = a * t;
  }
  else
  {
    x = a / t;
  }

  return x;
}